

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O0

UTF8Reader * __thiscall soul::UTF8Reader::operator++(UTF8Reader *this)

{
  char cVar1;
  char *pcVar2;
  uint local_18;
  uint32_t bit;
  char n;
  UTF8Reader *this_local;
  
  checkAssertion(*this->data != '\0',"*data != 0","operator++",0x52);
  pcVar2 = this->data;
  this->data = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 < '\0') {
    for (local_18 = 0x40; ((int)cVar1 & local_18) != 0 && 8 < local_18; local_18 = local_18 >> 1) {
      this->data = this->data + 1;
    }
  }
  return this;
}

Assistant:

UTF8Reader& UTF8Reader::operator++()
{
    SOUL_ASSERT (*data != 0); // trying to advance past the end of the string?
    auto n = (signed char) *data++;

    if (n < 0)
    {
        uint32_t bit = 0x40;

        while ((static_cast<uint32_t> (n) & bit) != 0 && bit > 0x8)
        {
            ++data;
            bit >>= 1;
        }
    }

    return *this;
}